

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ResourceTag RVar1;
  FILE *pFVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  DatabaseInterface *__p;
  pointer pDVar7;
  undefined8 uVar8;
  type pDVar9;
  __node_base_ptr *this;
  reference puVar10;
  VkDevice pVVar11;
  reference ppVVar12;
  reference pvVar13;
  long lVar14;
  char *pcVar15;
  reference ppVVar16;
  mapped_type *pmVar17;
  reference ppVVar18;
  reference ppVVar19;
  reference ppVVar20;
  size_type sVar21;
  size_type sVar22;
  pair<std::__detail::_Node_iterator<VkShaderModule_T_*,_true,_false>,_bool> pVar23;
  VulkanDevice *local_2448;
  byte local_2431;
  string local_2428;
  string local_2408;
  string local_23e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2308;
  undefined1 local_22e8 [8];
  string path_3;
  Hash module_hash_3;
  VkShaderModuleCreateInfo *local_22a0;
  VkShaderModuleCreateInfo *module_info_3;
  _Node_iterator_base<VkShaderModule_T_*,_false> _Stack_2290;
  uint index_2;
  undefined1 local_2288;
  VkShaderModule local_2280;
  VkShaderModule module_2;
  value_type pVStack_2270;
  uint32_t j_1;
  VkRayTracingPipelineCreateInfoKHR *info_2;
  size_t i_3;
  size_t raytracing_pipeline_count;
  string local_2238;
  string local_2218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2138;
  undefined1 local_2118 [8];
  string path_2;
  Hash module_hash_2;
  VkShaderModuleCreateInfo *local_20d0;
  VkShaderModuleCreateInfo *module_info_2;
  _Node_iterator_base<VkShaderModule_T_*,_false> _Stack_20c0;
  uint index_1;
  undefined1 local_20b8;
  VkShaderModule local_20b0;
  VkShaderModule module_1;
  VkComputePipelineCreateInfo *info_1;
  size_t i_2;
  size_t compute_pipeline_count;
  string local_2070;
  string local_2050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f70;
  undefined1 local_1f50 [8];
  string path_1;
  Hash module_hash_1;
  VkShaderModuleCreateInfo *local_1f08;
  VkShaderModuleCreateInfo *module_info_1;
  _Node_iterator_base<VkShaderModule_T_*,_false> _Stack_1ef8;
  uint index;
  undefined1 local_1ef0;
  VkShaderModule local_1ee8;
  VkShaderModule module;
  value_type pVStack_1ed8;
  uint32_t j;
  VkGraphicsPipelineCreateInfo *info;
  size_t i_1;
  size_t graphics_pipeline_count;
  string disassembled_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e80;
  undefined1 local_1e60 [8];
  string path;
  value_type module_hash;
  VkShaderModuleCreateInfo *local_1e18;
  VkShaderModuleCreateInfo *module_info;
  size_t i;
  size_t module_count;
  string disassembled;
  unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
  unique_shader_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *filter;
  ResourceTag *tag_2;
  ResourceTag *__end1;
  ResourceTag *__begin1;
  ResourceTag (*__range1) [9];
  DisasmReplayer replayer;
  StateReplayer state_replayer;
  unsigned_long local_1a58;
  unsigned_long hash;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range2_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  replays_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  replays_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  replays_graphics;
  ResourceTag tag_1;
  ResourceTag *__end3;
  ResourceTag *__begin3;
  ResourceTag (*__range3) [3];
  ResourceTag tag;
  ResourceTag *__end2;
  ResourceTag *__begin2;
  ResourceTag (*__range2) [3];
  bool replay_all;
  StateReplayer state_replayer_1;
  bool use_filter;
  StateReplayer application_info_replayer;
  VulkanDevice device;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  FilterReplayer filter_replayer;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  resolver;
  CLICallbacks local_4c0;
  undefined1 local_448 [8];
  CLIParser parser;
  anon_class_8_1_f722c831 local_3b0;
  function<void_(Fossilize::CLIParser_&)> local_3a8;
  anon_class_8_1_f4c703fe local_388;
  function<void_(Fossilize::CLIParser_&)> local_380;
  anon_class_8_1_07de1a1f local_360;
  function<void_(Fossilize::CLIParser_&)> local_358;
  anon_class_8_1_e44564ae local_338;
  function<void_(Fossilize::CLIParser_&)> local_330;
  anon_class_8_1_ce1e5952 local_310;
  function<void_(Fossilize::CLIParser_&)> local_308;
  anon_class_8_1_ca573fff local_2e8;
  function<void_(Fossilize::CLIParser_&)> local_2e0;
  anon_class_8_1_60e9c21f local_2c0;
  function<void_(Fossilize::CLIParser_&)> local_2b8;
  anon_class_8_1_65350a3f local_298;
  function<void_(Fossilize::CLIParser_&)> local_290;
  anon_class_8_1_898fd51e local_270;
  function<void_(Fossilize::CLIParser_&)> local_268;
  anon_class_8_1_898fd51e local_248;
  function<void_(Fossilize::CLIParser_&)> local_240;
  anon_class_1_0_00000001 local_219;
  function<void_(Fossilize::CLIParser_&)> local_218;
  anon_class_8_1_d50d87bc local_1f8;
  undefined1 local_1f0 [8];
  CLICallbacks cbs;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_modules;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_raytracing;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_compute;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  filter_graphics;
  undefined1 local_90 [3];
  bool module_only;
  DisasmMethod method;
  Options opts;
  string disasm_match;
  string output;
  string json_path;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(disasm_match.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&opts.features);
  Fossilize::VulkanDevice::Options::Options((Options *)local_90);
  filter_graphics._M_h._M_single_bucket._4_4_ = Asm;
  filter_graphics._M_h._M_single_bucket._3_1_ = 0;
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&filter_compute._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&filter_raytracing._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&filter_modules._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&cbs.default_handler._M_invoker);
  Fossilize::CLICallbacks::CLICallbacks((CLICallbacks *)local_1f0);
  local_1f8.json_path = (string *)((long)&output.field_2 + 8);
  std::function<void(char_const*)>::operator=
            ((function<void(char_const*)> *)&cbs.error_handler._M_invoker,&local_1f8);
  std::function<void(Fossilize::CLIParser&)>::function<main::__1,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_218,&local_219);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--help",&local_218);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_218);
  local_248.opts = (Options *)local_90;
  std::function<void(Fossilize::CLIParser&)>::function<main::__2,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_240,&local_248);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--device-index",&local_240);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_240);
  local_270.opts = (Options *)local_90;
  std::function<void(Fossilize::CLIParser&)>::function<main::__3,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_268,&local_270);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--enable-validation",&local_268);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_268);
  local_298.output = (string *)((long)&disasm_match.field_2 + 8);
  std::function<void(Fossilize::CLIParser&)>::function<main::__4,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_290,&local_298);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--output",&local_290);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_290);
  local_2c0.method = (DisasmMethod *)((long)&filter_graphics._M_h._M_single_bucket + 4);
  std::function<void(Fossilize::CLIParser&)>::function<main::__5,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_2b8,&local_2c0);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--target",&local_2b8);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_2b8);
  local_2e8.module_only = (bool *)((long)&filter_graphics._M_h._M_single_bucket + 3);
  std::function<void(Fossilize::CLIParser&)>::function<main::__6,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_2e0,&local_2e8);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--module-only",&local_2e0);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_2e0);
  local_310.filter_graphics =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&filter_compute._M_h._M_single_bucket;
  std::function<void(Fossilize::CLIParser&)>::function<main::__7,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_308,&local_310);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--filter-graphics",&local_308);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_308);
  local_338.filter_compute =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&filter_raytracing._M_h._M_single_bucket;
  std::function<void(Fossilize::CLIParser&)>::function<main::__8,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_330,&local_338);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--filter-compute",&local_330);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_330);
  local_360.filter_raytracing =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&filter_modules._M_h._M_single_bucket;
  std::function<void(Fossilize::CLIParser&)>::function<main::__9,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_358,&local_360);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--filter-raytracing",&local_358);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_358);
  local_388.filter_modules =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)&cbs.default_handler._M_invoker;
  std::function<void(Fossilize::CLIParser&)>::function<main::__10,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_380,&local_388);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--filter-module",&local_380);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_380);
  local_3b0.disasm_match = (string *)&opts.features;
  std::function<void(Fossilize::CLIParser&)>::function<main::__11,void>
            ((function<void(Fossilize::CLIParser&)> *)&local_3a8,&local_3b0);
  Fossilize::CLICallbacks::add((CLICallbacks *)local_1f0,"--disasm-match",&local_3a8);
  std::function<void_(Fossilize::CLIParser_&)>::~function(&local_3a8);
  std::function<void()>::operator=
            ((function<void()> *)&cbs.callbacks._M_h._M_single_bucket,
             (anon_class_1_0_00000001 *)&parser.field_0x8f);
  Fossilize::CLICallbacks::CLICallbacks(&local_4c0,(CLICallbacks *)local_1f0);
  Fossilize::CLIParser::CLIParser((CLIParser *)local_448,&local_4c0,argc + -1,argv + 1);
  Fossilize::CLICallbacks::~CLICallbacks(&local_4c0);
  bVar3 = Fossilize::CLIParser::parse((CLIParser *)local_448);
  if (!bVar3) {
    argv_local._4_4_ = 1;
    goto LAB_0012e234;
  }
  bVar3 = Fossilize::CLIParser::is_ended_state((CLIParser *)local_448);
  if (bVar3) {
    argv_local._4_4_ = 0;
    goto LAB_0012e234;
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    fprintf(_stderr,"Fossilize ERROR: No path to serialized state provided.\n");
    fflush(_stderr);
    print_help();
    argv_local._4_4_ = 1;
    goto LAB_0012e234;
  }
  pcVar6 = (char *)std::__cxx11::string::c_str();
  __p = Fossilize::create_database(pcVar6,ReadOnly);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&filter_replayer.pdf2,__p);
  pDVar7 = std::
           unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                         *)&filter_replayer.pdf2);
  uVar4 = (*pDVar7->_vptr_DatabaseInterface[2])();
  pFVar2 = _stderr;
  if ((uVar4 & 1) == 0) {
    uVar8 = std::__cxx11::string::c_str();
    fprintf(pFVar2,"Fossilize ERROR: Failed to open database: %s\n",uVar8);
    fflush(_stderr);
    argv_local._4_4_ = 1;
  }
  else {
    FilterReplayer::FilterReplayer
              ((FilterReplayer *)
               &state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &device.ycbcr_conversions.
                super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Fossilize::VulkanDevice::VulkanDevice((VulkanDevice *)&application_info_replayer);
    if (filter_graphics._M_h._M_single_bucket._4_4_ == ISA) {
      Fossilize::StateReplayer::StateReplayer((StateReplayer *)&stack0xffffffffffffe6c8);
      pDVar9 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                            *)&filter_replayer.pdf2);
      replay_all_hashes(RESOURCE_APPLICATION_INFO,pDVar9,(StateReplayer *)&stack0xffffffffffffe6c8,
                        (StateCreatorInterface *)
                        &state_json.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,
                        (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &device.ycbcr_conversions.
                         super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)0x0);
      local_90[1] = true;
      module_only = true;
      opts._0_8_ = filter_replayer.filter_modules_promoted._M_h._M_single_bucket;
      opts.application_info = filter_replayer.app;
      if ((filter_graphics._M_h._M_single_bucket._3_1_ & 1) == 0) {
        bVar3 = Fossilize::VulkanDevice::init_device
                          ((VulkanDevice *)&application_info_replayer,(Options *)local_90);
        if (bVar3) {
          bVar3 = Fossilize::VulkanDevice::has_amd_shader_info
                            ((VulkanDevice *)&application_info_replayer);
          if ((bVar3) ||
             (bVar3 = Fossilize::VulkanDevice::has_pipeline_stats
                                ((VulkanDevice *)&application_info_replayer), bVar3)) {
            bVar3 = false;
          }
          else {
            fprintf(_stderr,
                    "Fossilize ERROR: Neither AMD_shader_info or executable properties extension are available.\n"
                   );
            fflush(_stderr);
            argv_local._4_4_ = 1;
            bVar3 = true;
          }
        }
        else {
          fprintf(_stderr,"Fossilize ERROR: Failed to create device.\n");
          fflush(_stderr);
          argv_local._4_4_ = 1;
          bVar3 = true;
        }
      }
      else {
        fprintf(_stderr,"Fossilize ERROR: Cannot do module-only disassembly with ISA target.\n");
        fflush(_stderr);
        argv_local._4_4_ = 1;
        bVar3 = true;
      }
      Fossilize::StateReplayer::~StateReplayer((StateReplayer *)&stack0xffffffffffffe6c8);
      if (!bVar3) goto LAB_0012c841;
    }
    else {
LAB_0012c841:
      bVar3 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&filter_compute._M_h._M_single_bucket);
      local_2431 = 1;
      if (bVar3) {
        bVar3 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&filter_raytracing._M_h._M_single_bucket);
        local_2431 = 1;
        if (bVar3) {
          bVar3 = std::
                  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                  ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&filter_modules._M_h._M_single_bucket);
          local_2431 = 1;
          if (bVar3) {
            bVar3 = std::
                    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&cbs.default_handler._M_invoker);
            local_2431 = bVar3 ^ 0xff;
          }
        }
      }
      state_replayer_1.impl._7_1_ = local_2431 & 1;
      if ((state_replayer_1.impl._7_1_ != 0) &&
         ((filter_graphics._M_h._M_single_bucket._3_1_ & 1) == 0)) {
        Fossilize::StateReplayer::StateReplayer((StateReplayer *)&stack0xffffffffffffe6b8);
        Fossilize::StateReplayer::set_resolve_derivative_pipeline_handles
                  ((StateReplayer *)&stack0xffffffffffffe6b8,false);
        Fossilize::StateReplayer::set_resolve_shader_module_handles
                  ((StateReplayer *)&stack0xffffffffffffe6b8,false);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_replayer,
                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_compute._M_h._M_single_bucket);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_replayer.filter_graphics._M_h._M_single_bucket,
                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_raytracing._M_h._M_single_bucket);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_replayer.filter_compute._M_h._M_single_bucket,
                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_modules._M_h._M_single_bucket);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_replayer.filter_raytracing._M_h._M_single_bucket,
                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&cbs.default_handler._M_invoker);
        bVar3 = std::
                unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&filter_replayer.filter_raytracing._M_h._M_single_bucket);
        for (__end2 = main::early_playback_order; __end2 != main::playback_order;
            __end2 = __end2 + 1) {
          RVar1 = *__end2;
          pDVar9 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                *)&filter_replayer.pdf2);
          replay_all_hashes(RVar1,pDVar9,(StateReplayer *)&stack0xffffffffffffe6b8,
                            (StateCreatorInterface *)
                            &state_json.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &device.ycbcr_conversions.
                             super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)0x0);
        }
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&replays_compute._M_h._M_single_bucket,
                          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&filter_replayer);
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&replays_raytracing._M_h._M_single_bucket,
                          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&filter_replayer.filter_graphics._M_h._M_single_bucket);
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&__range2_1,
                          (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)&filter_replayer.filter_compute._M_h._M_single_bucket);
          pDVar9 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                *)&filter_replayer.pdf2);
          replay_all_hashes(RESOURCE_GRAPHICS_PIPELINE,pDVar9,
                            (StateReplayer *)&stack0xffffffffffffe6b8,
                            (StateCreatorInterface *)
                            &state_json.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &device.ycbcr_conversions.
                             super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&replays_compute._M_h._M_single_bucket);
          pDVar9 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                *)&filter_replayer.pdf2);
          replay_all_hashes(RESOURCE_COMPUTE_PIPELINE,pDVar9,
                            (StateReplayer *)&stack0xffffffffffffe6b8,
                            (StateCreatorInterface *)
                            &state_json.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &device.ycbcr_conversions.
                             super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&replays_raytracing._M_h._M_single_bucket);
          pDVar9 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                *)&filter_replayer.pdf2);
          replay_all_hashes(RESOURCE_RAYTRACING_PIPELINE,pDVar9,
                            (StateReplayer *)&stack0xffffffffffffe6b8,
                            (StateCreatorInterface *)
                            &state_json.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &device.ycbcr_conversions.
                             super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)&__range2_1);
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&__range2_1);
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&replays_raytracing._M_h._M_single_bucket);
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&replays_compute._M_h._M_single_bucket);
        }
        else {
          for (__end3 = main::playback_order; __end3 != main::playback_order; __end3 = __end3 + 1) {
            RVar1 = *__end3;
            pDVar9 = std::
                     unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                     ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                  *)&filter_replayer.pdf2);
            replay_all_hashes(RVar1,pDVar9,(StateReplayer *)&stack0xffffffffffffe6b8,
                              (StateCreatorInterface *)
                              &state_json.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &device.ycbcr_conversions.
                               super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                               *)0x0);
          }
        }
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_compute._M_h._M_single_bucket,
                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_replayer);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_raytracing._M_h._M_single_bucket,
                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_replayer.filter_graphics._M_h._M_single_bucket);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_modules._M_h._M_single_bucket,
                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_replayer.filter_compute._M_h._M_single_bucket);
        std::
        unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&cbs.default_handler._M_invoker,
                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)&filter_replayer.filter_raytracing._M_h._M_single_bucket);
        this = &filter_replayer.filter_modules._M_h._M_single_bucket;
        __end2_1 = std::
                   unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   ::begin((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)this);
        hash = (unsigned_long)
               std::
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                      *)this);
        while (bVar3 = std::__detail::operator!=
                                 (&__end2_1.super__Node_iterator_base<unsigned_long,_false>,
                                  (_Node_iterator_base<unsigned_long,_false> *)&hash), bVar3) {
          puVar10 = std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*(&__end2_1);
          local_1a58 = *puVar10;
          std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&cbs.default_handler._M_invoker,&local_1a58);
          std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++(&__end2_1);
        }
        Fossilize::StateReplayer::~StateReplayer((StateReplayer *)&stack0xffffffffffffe6b8);
      }
      Fossilize::StateReplayer::StateReplayer
                ((StateReplayer *)&replayer.filter_modules._M_h._M_single_bucket);
      pVVar11 = Fossilize::VulkanDevice::get_device((VulkanDevice *)&application_info_replayer);
      if (pVVar11 == (VkDevice)0x0) {
        local_2448 = (VulkanDevice *)0x0;
      }
      else {
        local_2448 = (VulkanDevice *)&application_info_replayer;
      }
      DisasmReplayer::DisasmReplayer((DisasmReplayer *)&__range1,local_2448);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&replayer.pipeline_cache,
                  (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&filter_compute._M_h._M_single_bucket);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&replayer.filter_graphics._M_h._M_single_bucket,
                  (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&filter_raytracing._M_h._M_single_bucket);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&replayer.filter_compute._M_h._M_single_bucket,
                  (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&filter_modules._M_h._M_single_bucket);
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::operator=((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&replayer.filter_raytracing._M_h._M_single_bucket,
                  (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&cbs.default_handler._M_invoker);
      for (__end1 = main::playback_order; __end1 != (ResourceTag *)&std::piecewise_construct;
          __end1 = __end1 + 1) {
        if (((filter_graphics._M_h._M_single_bucket._3_1_ & 1) == 0) ||
           (*__end1 == RESOURCE_SHADER_MODULE)) {
          fprintf(_stderr,"Fossilize INFO: Replaying tag: %s\n",main::tag_names[*__end1]);
          fflush(_stderr);
          unique_shader_modules._M_h._M_single_bucket = (__node_base_ptr)0x0;
          if ((state_replayer_1.impl._7_1_ & 1) != 0) {
            switch(*__end1) {
            case RESOURCE_SHADER_MODULE:
              unique_shader_modules._M_h._M_single_bucket =
                   (__node_base_ptr)&replayer.filter_raytracing._M_h._M_single_bucket;
              break;
            default:
              break;
            case RESOURCE_GRAPHICS_PIPELINE:
              unique_shader_modules._M_h._M_single_bucket =
                   (__node_base_ptr)&replayer.pipeline_cache;
              break;
            case RESOURCE_COMPUTE_PIPELINE:
              unique_shader_modules._M_h._M_single_bucket =
                   (__node_base_ptr)&replayer.filter_graphics._M_h._M_single_bucket;
              break;
            case RESOURCE_RAYTRACING_PIPELINE:
              unique_shader_modules._M_h._M_single_bucket =
                   (__node_base_ptr)&replayer.filter_compute._M_h._M_single_bucket;
            }
          }
          RVar1 = *__end1;
          pDVar9 = std::
                   unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                   ::operator*((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                *)&filter_replayer.pdf2);
          replay_all_hashes(RVar1,pDVar9,
                            (StateReplayer *)&replayer.filter_modules._M_h._M_single_bucket,
                            (StateCreatorInterface *)&__range1,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            &device.ycbcr_conversions.
                             super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)unique_shader_modules._M_h._M_single_bucket);
          fprintf(_stderr,"Fossilize INFO: Replayed tag: %s\n",main::tag_names[*__end1]);
          fflush(_stderr);
        }
      }
      std::
      unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
      ::unordered_set((unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
                       *)((long)&disassembled.field_2 + 8));
      if ((filter_graphics._M_h._M_single_bucket._3_1_ & 1) == 0) {
        std::__cxx11::string::string((string *)&graphics_pipeline_count);
        i_1 = std::
              vector<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
              ::size((vector<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
                      *)&replayer.render_pass_infos.
                         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        for (info = (VkGraphicsPipelineCreateInfo *)0x0; info < i_1;
            info = (VkGraphicsPipelineCreateInfo *)((long)&info->sType + 1)) {
          ppVVar16 = std::
                     vector<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
                     ::operator[]((vector<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
                                   *)&replayer.render_pass_infos.
                                      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (size_type)info);
          pVStack_1ed8 = *ppVVar16;
          for (module._4_4_ = 0; module._4_4_ < pVStack_1ed8->stageCount;
              module._4_4_ = module._4_4_ + 1) {
            local_1ee8 = pVStack_1ed8->pStages[module._4_4_].module;
            pVar23 = std::
                     unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
                     ::insert((unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
                               *)((long)&disassembled.field_2 + 8),&local_1ee8);
            _Stack_1ef8._M_cur =
                 (__node_type *)
                 pVar23.first.super__Node_iterator_base<VkShaderModule_T_*,_false>._M_cur;
            local_1ef0 = pVar23.second;
            pmVar17 = std::
                      unordered_map<VkShaderModule_T_*,_unsigned_int,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>_>
                      ::operator[]((unordered_map<VkShaderModule_T_*,_unsigned_int,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>_>
                                    *)&replayer.module_hashes.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   &local_1ee8);
            module_info_1._4_4_ = *pmVar17;
            ppVVar12 = std::
                       vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                       ::operator[]((vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                                     *)&replayer.pipeline_layout_infos.
                                        super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (ulong)module_info_1._4_4_);
            local_1f08 = *ppVVar12;
            ppVVar18 = std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::operator[]
                                 ((vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_> *)
                                  &replayer.compute_pipelines.
                                   super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (size_type)info);
            disassemble_spirv_abi_cxx11_
                      ((string *)&module_hash_1,(VulkanDevice *)&application_info_replayer,*ppVVar18
                       ,filter_graphics._M_h._M_single_bucket._4_4_,
                       pVStack_1ed8->pStages[module._4_4_].stage,local_1f08,
                       pVStack_1ed8->pStages[module._4_4_].pName);
            std::__cxx11::string::operator=
                      ((string *)&graphics_pipeline_count,(string *)&module_hash_1);
            std::__cxx11::string::~string((string *)&module_hash_1);
            pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &replayer.raytracing_hashes.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)module_info_1._4_4_);
            path_1.field_2._8_8_ = *pvVar13;
            std::operator+(&local_2030,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&disasm_match.field_2 + 8),"/");
            uint64_string_abi_cxx11_(&local_2050,path_1.field_2._8_8_);
            std::operator+(&local_2010,&local_2030,&local_2050);
            std::operator+(&local_1ff0,&local_2010,".");
            std::operator+(&local_1fd0,&local_1ff0,pVStack_1ed8->pStages[module._4_4_].pName);
            std::operator+(&local_1fb0,&local_1fd0,".");
            pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &replayer.raytracing_infos.
                                  super__Vector_base<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)info
                                );
            uint64_string_abi_cxx11_(&local_2070,*pvVar13);
            std::operator+(&local_1f90,&local_1fb0,&local_2070);
            std::operator+(&local_1f70,&local_1f90,".");
            stage_to_string_abi_cxx11_
                      ((string *)&compute_pipeline_count,pVStack_1ed8->pStages[module._4_4_].stage);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1f50,&local_1f70,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &compute_pipeline_count);
            std::__cxx11::string::~string((string *)&compute_pipeline_count);
            std::__cxx11::string::~string((string *)&local_1f70);
            std::__cxx11::string::~string((string *)&local_1f90);
            std::__cxx11::string::~string((string *)&local_2070);
            std::__cxx11::string::~string((string *)&local_1fb0);
            std::__cxx11::string::~string((string *)&local_1fd0);
            std::__cxx11::string::~string((string *)&local_1ff0);
            std::__cxx11::string::~string((string *)&local_2010);
            std::__cxx11::string::~string((string *)&local_2050);
            std::__cxx11::string::~string((string *)&local_2030);
            uVar5 = std::__cxx11::string::empty();
            pFVar2 = _stderr;
            if ((uVar5 & 1) == 0) {
              lVar14 = std::__cxx11::string::find
                                 ((string *)&graphics_pipeline_count,(ulong)&opts.features);
              pFVar2 = _stderr;
              if (lVar14 != -1) {
                uVar8 = std::__cxx11::string::c_str();
                fprintf(pFVar2,"Fossilize INFO: Found matching string, dumping disassembly to: %s\n"
                        ,uVar8);
                fflush(_stderr);
              }
            }
            else {
              uVar8 = std::__cxx11::string::c_str();
              fprintf(pFVar2,"Fossilize INFO: Dumping disassembly to: %s\n",uVar8);
              fflush(_stderr);
            }
            pcVar6 = (char *)std::__cxx11::string::c_str();
            pcVar15 = (char *)std::__cxx11::string::c_str();
            bVar3 = Fossilize::write_string_to_file(pcVar6,pcVar15);
            pFVar2 = _stderr;
            if (!bVar3) {
              uVar8 = std::__cxx11::string::c_str();
              fprintf(pFVar2,"Fossilize ERROR: Failed to write disassembly to file: %s\n",uVar8);
              fflush(_stderr);
              argv_local._4_4_ = 1;
            }
            bVar3 = !bVar3;
            std::__cxx11::string::~string((string *)local_1f50);
            if (bVar3) goto LAB_0012e1b5;
          }
        }
        i_2 = std::
              vector<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
              ::size((vector<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
                      *)&replayer.graphics_infos.
                         super__Vector_base<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        for (info_1 = (VkComputePipelineCreateInfo *)0x0; info_1 < i_2;
            info_1 = (VkComputePipelineCreateInfo *)((long)&info_1->sType + 1)) {
          ppVVar19 = std::
                     vector<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
                     ::operator[]((vector<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
                                   *)&replayer.graphics_infos.
                                      super__Vector_base<const_VkGraphicsPipelineCreateInfo_*,_std::allocator<const_VkGraphicsPipelineCreateInfo_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (size_type)info_1);
          module_1 = (VkShaderModule)*ppVVar19;
          local_20b0 = (((value_type)module_1)->stage).module;
          pVar23 = std::
                   unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
                   ::insert((unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
                             *)((long)&disassembled.field_2 + 8),&local_20b0);
          _Stack_20c0._M_cur =
               (__node_type *)
               pVar23.first.super__Node_iterator_base<VkShaderModule_T_*,_false>._M_cur;
          local_20b8 = pVar23.second;
          pmVar17 = std::
                    unordered_map<VkShaderModule_T_*,_unsigned_int,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>_>
                    ::operator[]((unordered_map<VkShaderModule_T_*,_unsigned_int,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>_>
                                  *)&replayer.module_hashes.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_20b0)
          ;
          module_info_2._4_4_ = *pmVar17;
          ppVVar12 = std::
                     vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                     ::operator[]((vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                                   *)&replayer.pipeline_layout_infos.
                                      super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)module_info_2._4_4_);
          local_20d0 = *ppVVar12;
          ppVVar18 = std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::operator[]
                               ((vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_> *)
                                &replayer.render_passes.
                                 super__Vector_base<VkRenderPass_T_*,_std::allocator<VkRenderPass_T_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (size_type)info_1);
          disassemble_spirv_abi_cxx11_
                    ((string *)&module_hash_2,(VulkanDevice *)&application_info_replayer,*ppVVar18,
                     filter_graphics._M_h._M_single_bucket._4_4_,
                     *(VkShaderStageFlagBits *)(module_1 + 0x2c),local_20d0,
                     *(char **)(module_1 + 0x38));
          std::__cxx11::string::operator=
                    ((string *)&graphics_pipeline_count,(string *)&module_hash_2);
          std::__cxx11::string::~string((string *)&module_hash_2);
          pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &replayer.raytracing_hashes.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (ulong)module_info_2._4_4_);
          path_2.field_2._8_8_ = *pvVar13;
          std::operator+(&local_21f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&disasm_match.field_2 + 8),"/");
          uint64_string_abi_cxx11_(&local_2218,path_2.field_2._8_8_);
          std::operator+(&local_21d8,&local_21f8,&local_2218);
          std::operator+(&local_21b8,&local_21d8,".");
          std::operator+(&local_2198,&local_21b8,*(char **)(module_1 + 0x38));
          std::operator+(&local_2178,&local_2198,".");
          pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &replayer.graphics_hashes.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)info_1)
          ;
          uint64_string_abi_cxx11_(&local_2238,*pvVar13);
          std::operator+(&local_2158,&local_2178,&local_2238);
          std::operator+(&local_2138,&local_2158,".");
          stage_to_string_abi_cxx11_
                    ((string *)&raytracing_pipeline_count,
                     *(VkShaderStageFlagBits *)(module_1 + 0x2c));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2118,&local_2138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &raytracing_pipeline_count);
          std::__cxx11::string::~string((string *)&raytracing_pipeline_count);
          std::__cxx11::string::~string((string *)&local_2138);
          std::__cxx11::string::~string((string *)&local_2158);
          std::__cxx11::string::~string((string *)&local_2238);
          std::__cxx11::string::~string((string *)&local_2178);
          std::__cxx11::string::~string((string *)&local_2198);
          std::__cxx11::string::~string((string *)&local_21b8);
          std::__cxx11::string::~string((string *)&local_21d8);
          std::__cxx11::string::~string((string *)&local_2218);
          std::__cxx11::string::~string((string *)&local_21f8);
          uVar5 = std::__cxx11::string::empty();
          pFVar2 = _stderr;
          if ((uVar5 & 1) == 0) {
            lVar14 = std::__cxx11::string::find
                               ((string *)&graphics_pipeline_count,(ulong)&opts.features);
            pFVar2 = _stderr;
            if (lVar14 != -1) {
              uVar8 = std::__cxx11::string::c_str();
              fprintf(pFVar2,"Fossilize INFO: Found matching string, dumping disassembly to: %s\n",
                      uVar8);
              fflush(_stderr);
            }
          }
          else {
            uVar8 = std::__cxx11::string::c_str();
            fprintf(pFVar2,"Fossilize INFO: Dumping disassembly to: %s\n",uVar8);
            fflush(_stderr);
          }
          pcVar6 = (char *)std::__cxx11::string::c_str();
          pcVar15 = (char *)std::__cxx11::string::c_str();
          bVar3 = Fossilize::write_string_to_file(pcVar6,pcVar15);
          pFVar2 = _stderr;
          if (!bVar3) {
            uVar8 = std::__cxx11::string::c_str();
            fprintf(pFVar2,"Fossilize ERROR: Failed to write disassembly to file: %s\n",uVar8);
            fflush(_stderr);
            argv_local._4_4_ = 1;
          }
          bVar3 = !bVar3;
          std::__cxx11::string::~string((string *)local_2118);
          if (bVar3) goto LAB_0012e1b5;
        }
        i_3 = std::
              vector<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
              ::size((vector<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
                      *)&replayer.compute_infos.
                         super__Vector_base<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
        for (info_2 = (VkRayTracingPipelineCreateInfoKHR *)0x0; pFVar2 = _stderr, info_2 < i_3;
            info_2 = (VkRayTracingPipelineCreateInfoKHR *)((long)&info_2->sType + 1)) {
          ppVVar20 = std::
                     vector<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
                     ::operator[]((vector<const_VkRayTracingPipelineCreateInfoKHR_*,_std::allocator<const_VkRayTracingPipelineCreateInfoKHR_*>_>
                                   *)&replayer.compute_infos.
                                      super__Vector_base<const_VkComputePipelineCreateInfo_*,_std::allocator<const_VkComputePipelineCreateInfo_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (size_type)info_2);
          pVStack_2270 = *ppVVar20;
          for (module_2._4_4_ = 0; module_2._4_4_ < pVStack_2270->stageCount;
              module_2._4_4_ = module_2._4_4_ + 1) {
            local_2280 = pVStack_2270->pStages[module_2._4_4_].module;
            pVar23 = std::
                     unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
                     ::insert((unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
                               *)((long)&disassembled.field_2 + 8),&local_2280);
            _Stack_2290._M_cur =
                 (__node_type *)
                 pVar23.first.super__Node_iterator_base<VkShaderModule_T_*,_false>._M_cur;
            local_2288 = pVar23.second;
            pmVar17 = std::
                      unordered_map<VkShaderModule_T_*,_unsigned_int,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>_>
                      ::operator[]((unordered_map<VkShaderModule_T_*,_unsigned_int,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<std::pair<VkShaderModule_T_*const,_unsigned_int>_>_>
                                    *)&replayer.module_hashes.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   &local_2280);
            module_info_3._4_4_ = *pmVar17;
            ppVVar12 = std::
                       vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                       ::operator[]((vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                                     *)&replayer.pipeline_layout_infos.
                                        super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (ulong)module_info_3._4_4_);
            local_22a0 = *ppVVar12;
            ppVVar18 = std::vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>::operator[]
                                 ((vector<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_> *)
                                  &replayer.graphics_pipelines.
                                   super__Vector_base<VkPipeline_T_*,_std::allocator<VkPipeline_T_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (size_type)info_2);
            disassemble_spirv_abi_cxx11_
                      ((string *)&module_hash_3,(VulkanDevice *)&application_info_replayer,*ppVVar18
                       ,filter_graphics._M_h._M_single_bucket._4_4_,
                       pVStack_2270->pStages[module_2._4_4_].stage,local_22a0,
                       pVStack_2270->pStages[module_2._4_4_].pName);
            std::__cxx11::string::operator=
                      ((string *)&graphics_pipeline_count,(string *)&module_hash_3);
            std::__cxx11::string::~string((string *)&module_hash_3);
            pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &replayer.raytracing_hashes.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (ulong)module_info_3._4_4_);
            path_3.field_2._8_8_ = *pvVar13;
            std::operator+(&local_23c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&disasm_match.field_2 + 8),"/");
            uint64_string_abi_cxx11_(&local_23e8,path_3.field_2._8_8_);
            std::operator+(&local_23a8,&local_23c8,&local_23e8);
            std::operator+(&local_2388,&local_23a8,".");
            std::operator+(&local_2368,&local_2388,pVStack_2270->pStages[module_2._4_4_].pName);
            std::operator+(&local_2348,&local_2368,".");
            pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &replayer.compute_hashes.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (size_type)info_2);
            uint64_string_abi_cxx11_(&local_2408,*pvVar13);
            std::operator+(&local_2328,&local_2348,&local_2408);
            std::operator+(&local_2308,&local_2328,".");
            stage_to_string_abi_cxx11_(&local_2428,pVStack_2270->pStages[module_2._4_4_].stage);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_22e8,&local_2308,&local_2428);
            std::__cxx11::string::~string((string *)&local_2428);
            std::__cxx11::string::~string((string *)&local_2308);
            std::__cxx11::string::~string((string *)&local_2328);
            std::__cxx11::string::~string((string *)&local_2408);
            std::__cxx11::string::~string((string *)&local_2348);
            std::__cxx11::string::~string((string *)&local_2368);
            std::__cxx11::string::~string((string *)&local_2388);
            std::__cxx11::string::~string((string *)&local_23a8);
            std::__cxx11::string::~string((string *)&local_23e8);
            std::__cxx11::string::~string((string *)&local_23c8);
            uVar5 = std::__cxx11::string::empty();
            pFVar2 = _stderr;
            if ((uVar5 & 1) == 0) {
              lVar14 = std::__cxx11::string::find
                                 ((string *)&graphics_pipeline_count,(ulong)&opts.features);
              pFVar2 = _stderr;
              if (lVar14 != -1) {
                uVar8 = std::__cxx11::string::c_str();
                fprintf(pFVar2,"Fossilize INFO: Found matching string, dumping disassembly to: %s\n"
                        ,uVar8);
                fflush(_stderr);
              }
            }
            else {
              uVar8 = std::__cxx11::string::c_str();
              fprintf(pFVar2,"Fossilize INFO: Dumping disassembly to: %s\n",uVar8);
              fflush(_stderr);
            }
            pcVar6 = (char *)std::__cxx11::string::c_str();
            pcVar15 = (char *)std::__cxx11::string::c_str();
            bVar3 = Fossilize::write_string_to_file(pcVar6,pcVar15);
            pFVar2 = _stderr;
            if (!bVar3) {
              uVar8 = std::__cxx11::string::c_str();
              fprintf(pFVar2,"Fossilize ERROR: Failed to write disassembly to file: %s\n",uVar8);
              fflush(_stderr);
              argv_local._4_4_ = 1;
            }
            bVar3 = !bVar3;
            std::__cxx11::string::~string((string *)local_22e8);
            if (bVar3) goto LAB_0012e1b5;
          }
        }
        sVar21 = std::
                 unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
                 ::size((unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
                         *)((long)&disassembled.field_2 + 8));
        sVar22 = std::
                 vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                 ::size((vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                         *)&replayer.pipeline_layout_infos.
                            super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        fprintf(pFVar2,"Fossilize INFO: Shader modules used: %u, shader modules in database: %u\n",
                sVar21 & 0xffffffff,sVar22 & 0xffffffff);
        fflush(_stderr);
        bVar3 = false;
LAB_0012e1b5:
        std::__cxx11::string::~string((string *)&graphics_pipeline_count);
      }
      else {
        std::__cxx11::string::string((string *)&module_count);
        i = std::
            vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
            ::size((vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                    *)&replayer.pipeline_layout_infos.
                       super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        for (module_info = (VkShaderModuleCreateInfo *)0x0; module_info < i;
            module_info = (VkShaderModuleCreateInfo *)((long)&module_info->sType + 1)) {
          ppVVar12 = std::
                     vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                     ::operator[]((vector<const_VkShaderModuleCreateInfo_*,_std::allocator<const_VkShaderModuleCreateInfo_*>_>
                                   *)&replayer.pipeline_layout_infos.
                                      super__Vector_base<const_VkPipelineLayoutCreateInfo_*,_std::allocator<const_VkPipelineLayoutCreateInfo_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (size_type)module_info);
          local_1e18 = *ppVVar12;
          disassemble_spirv_abi_cxx11_
                    ((string *)&module_hash,(VulkanDevice *)&application_info_replayer,
                     (VkPipeline)0x0,filter_graphics._M_h._M_single_bucket._4_4_,VK_SHADER_STAGE_ALL
                     ,local_1e18,(char *)0x0);
          std::__cxx11::string::operator=((string *)&module_count,(string *)&module_hash);
          std::__cxx11::string::~string((string *)&module_hash);
          pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &replayer.raytracing_hashes.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)module_info);
          path.field_2._8_8_ = *pvVar13;
          std::operator+(&local_1e80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&disasm_match.field_2 + 8),"/");
          uint64_string_abi_cxx11_((string *)((long)&disassembled_1.field_2 + 8),path.field_2._8_8_)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1e60,&local_1e80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&disassembled_1.field_2 + 8));
          std::__cxx11::string::~string((string *)(disassembled_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)&local_1e80);
          uVar5 = std::__cxx11::string::empty();
          pFVar2 = _stderr;
          if ((uVar5 & 1) == 0) {
            lVar14 = std::__cxx11::string::find((string *)&module_count,(ulong)&opts.features);
            pFVar2 = _stderr;
            if (lVar14 != -1) {
              uVar8 = std::__cxx11::string::c_str();
              fprintf(pFVar2,"Fossilize INFO: Found matching string, dumping disassembly to: %s\n",
                      uVar8);
              fflush(_stderr);
            }
          }
          else {
            uVar8 = std::__cxx11::string::c_str();
            fprintf(pFVar2,"Fossilize INFO: Dumping disassembly to: %s\n",uVar8);
            fflush(_stderr);
          }
          pcVar6 = (char *)std::__cxx11::string::c_str();
          pcVar15 = (char *)std::__cxx11::string::c_str();
          bVar3 = Fossilize::write_string_to_file(pcVar6,pcVar15);
          pFVar2 = _stderr;
          if (!bVar3) {
            uVar8 = std::__cxx11::string::c_str();
            fprintf(pFVar2,"Fossilize ERROR: Failed to write disassembly to file: %s\n",uVar8);
            fflush(_stderr);
            argv_local._4_4_ = 1;
          }
          bVar3 = !bVar3;
          std::__cxx11::string::~string((string *)local_1e60);
          if (bVar3) goto LAB_0012d252;
        }
        bVar3 = false;
LAB_0012d252:
        std::__cxx11::string::~string((string *)&module_count);
      }
      if (!bVar3) {
        argv_local._4_4_ = 0;
      }
      std::
      unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
      ::~unordered_set((unordered_set<VkShaderModule_T_*,_std::hash<VkShaderModule_T_*>,_std::equal_to<VkShaderModule_T_*>,_std::allocator<VkShaderModule_T_*>_>
                        *)((long)&disassembled.field_2 + 8));
      DisasmReplayer::~DisasmReplayer((DisasmReplayer *)&__range1);
      Fossilize::StateReplayer::~StateReplayer
                ((StateReplayer *)&replayer.filter_modules._M_h._M_single_bucket);
    }
    Fossilize::VulkanDevice::~VulkanDevice((VulkanDevice *)&application_info_replayer);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &device.ycbcr_conversions.
                super__Vector_base<VkSamplerYcbcrConversion_T_*,_std::allocator<VkSamplerYcbcrConversion_T_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    FilterReplayer::~FilterReplayer
              ((FilterReplayer *)
               &state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  }
  std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  ::~unique_ptr((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                 *)&filter_replayer.pdf2);
LAB_0012e234:
  Fossilize::CLIParser::~CLIParser((CLIParser *)local_448);
  Fossilize::CLICallbacks::~CLICallbacks((CLICallbacks *)local_1f0);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&cbs.default_handler._M_invoker);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&filter_modules._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&filter_raytracing._M_h._M_single_bucket);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~unordered_set((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)&filter_compute._M_h._M_single_bucket);
  std::__cxx11::string::~string((string *)&opts.features);
  std::__cxx11::string::~string((string *)(disasm_match.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	string json_path;
	string output;
	string disasm_match;
	VulkanDevice::Options opts;
	DisasmMethod method = DisasmMethod::Asm;
	bool module_only = false;

	std::unordered_set<Hash> filter_graphics;
	std::unordered_set<Hash> filter_compute;
	std::unordered_set<Hash> filter_raytracing;
	std::unordered_set<Hash> filter_modules;

	CLICallbacks cbs;
	cbs.default_handler = [&](const char *arg) { json_path = arg; };
	cbs.add("--help", [](CLIParser &parser) { print_help(); parser.end(); });
	cbs.add("--device-index", [&](CLIParser &parser) { opts.device_index = parser.next_uint(); });
	cbs.add("--enable-validation", [&](CLIParser &) { opts.enable_validation = true; });
	cbs.add("--output", [&](CLIParser &parser) { output = parser.next_string(); });
	cbs.add("--target", [&](CLIParser &parser) {
		method = method_from_string(parser.next_string());
	});
	cbs.add("--module-only", [&](CLIParser &) { module_only = true; });
	cbs.add("--filter-graphics", [&](CLIParser &parser) {
		filter_graphics.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-compute", [&](CLIParser &parser) {
		filter_compute.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-raytracing", [&](CLIParser &parser) {
		filter_raytracing.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--filter-module", [&](CLIParser &parser) {
		filter_modules.insert(strtoull(parser.next_string(), nullptr, 16));
	});
	cbs.add("--disasm-match", [&](CLIParser &parser) {
		disasm_match = parser.next_string();
	});
	cbs.error_handler = [] { print_help(); };

	CLIParser parser(move(cbs), argc - 1, argv + 1);
	if (!parser.parse())
		return EXIT_FAILURE;
	if (parser.is_ended_state())
		return EXIT_SUCCESS;

	if (json_path.empty())
	{
		LOGE("No path to serialized state provided.\n");
		print_help();
		return EXIT_FAILURE;
	}

	auto resolver = unique_ptr<DatabaseInterface>(create_database(json_path.c_str(), DatabaseMode::ReadOnly));
	if (!resolver->prepare())
	{
		LOGE("Failed to open database: %s\n", json_path.c_str());
		return EXIT_FAILURE;
	}

	FilterReplayer filter_replayer;
	vector<uint8_t> state_json;

	VulkanDevice device;
	if (method == DisasmMethod::ISA)
	{
		StateReplayer application_info_replayer;
		replay_all_hashes(RESOURCE_APPLICATION_INFO, *resolver, application_info_replayer, filter_replayer, state_json, nullptr);

		opts.want_amd_shader_info = true;
		opts.want_pipeline_stats = true;
		opts.application_info = filter_replayer.app;
		opts.features = filter_replayer.pdf2;

		if (module_only)
		{
			LOGE("Cannot do module-only disassembly with ISA target.\n");
			return EXIT_FAILURE;
		}

		if (!device.init_device(opts))
		{
			LOGE("Failed to create device.\n");
			return EXIT_FAILURE;
		}

		if (!device.has_amd_shader_info() && !device.has_pipeline_stats())
		{
			LOGE("Neither AMD_shader_info or executable properties extension are available.\n");
			return EXIT_FAILURE;
		}
	}

	bool use_filter = !filter_graphics.empty() || !filter_compute.empty() ||
	                  !filter_raytracing.empty() || !filter_modules.empty();

	if (use_filter && !module_only)
	{
		StateReplayer state_replayer;

		state_replayer.set_resolve_derivative_pipeline_handles(false);
		state_replayer.set_resolve_shader_module_handles(false);

		filter_replayer.filter_graphics = std::move(filter_graphics);
		filter_replayer.filter_compute = std::move(filter_compute);
		filter_replayer.filter_raytracing = std::move(filter_raytracing);
		filter_replayer.filter_modules = std::move(filter_modules);

		// Don't know which pipelines depend on a module in question, so need to replay all pipelines and promote on demand.
		bool replay_all = !filter_replayer.filter_modules.empty();

		static const ResourceTag early_playback_order[] = {
			RESOURCE_DESCRIPTOR_SET_LAYOUT, // Implicitly pulls in samplers.
			RESOURCE_PIPELINE_LAYOUT,
			RESOURCE_RENDER_PASS,
		};

		for (auto tag : early_playback_order)
			replay_all_hashes(tag, *resolver, state_replayer, filter_replayer, state_json, nullptr);

		if (replay_all)
		{
			static const ResourceTag playback_order[] = {
				RESOURCE_GRAPHICS_PIPELINE,
				RESOURCE_COMPUTE_PIPELINE,
				RESOURCE_RAYTRACING_PIPELINE,
			};

			for (auto tag : playback_order)
				replay_all_hashes(tag, *resolver, state_replayer, filter_replayer, state_json, nullptr);
		}
		else
		{
			// Need copies since we might modify the hashmap inside the replay callback.
			auto replays_graphics = filter_replayer.filter_graphics;
			auto replays_compute = filter_replayer.filter_compute;
			auto replays_raytracing = filter_replayer.filter_raytracing;
			replay_all_hashes(RESOURCE_GRAPHICS_PIPELINE, *resolver, state_replayer,
			                  filter_replayer, state_json, &replays_graphics);
			replay_all_hashes(RESOURCE_COMPUTE_PIPELINE, *resolver, state_replayer,
			                  filter_replayer, state_json, &replays_compute);
			replay_all_hashes(RESOURCE_RAYTRACING_PIPELINE, *resolver, state_replayer,
			                  filter_replayer, state_json, &replays_raytracing);
		}

		filter_graphics = std::move(filter_replayer.filter_graphics);
		filter_compute = std::move(filter_replayer.filter_compute);
		filter_raytracing = std::move(filter_replayer.filter_raytracing);
		filter_modules = std::move(filter_replayer.filter_modules);
		for (auto hash : filter_replayer.filter_modules_promoted)
			filter_modules.insert(hash);
	}

	StateReplayer state_replayer;
	DisasmReplayer replayer(device.get_device() ? &device : nullptr);
	replayer.filter_graphics = std::move(filter_graphics);
	replayer.filter_compute = std::move(filter_compute);
	replayer.filter_raytracing = std::move(filter_raytracing);
	replayer.filter_modules = std::move(filter_modules);

	static const ResourceTag playback_order[] = {
		RESOURCE_APPLICATION_INFO, // This will create the device, etc.
		RESOURCE_SHADER_MODULE, // Kick off shader modules first since it can be done in a thread while we deal with trivial objects.
		RESOURCE_SAMPLER, // Trivial, run in main thread.
		RESOURCE_DESCRIPTOR_SET_LAYOUT, // Trivial, run in main thread
		RESOURCE_PIPELINE_LAYOUT, // Trivial, run in main thread
		RESOURCE_RENDER_PASS, // Trivial, run in main thread
		RESOURCE_GRAPHICS_PIPELINE, // Multi-threaded
		RESOURCE_COMPUTE_PIPELINE, // Multi-threaded
		RESOURCE_RAYTRACING_PIPELINE, // Multi-threaded
	};

	static const char *tag_names[] = {
		"AppInfo",
		"Sampler",
		"Descriptor Set Layout",
		"Pipeline Layout",
		"Shader Module",
		"Render Pass",
		"Graphics Pipeline",
		"Compute Pipeline",
		"Info Links",
		"Raytracing Pipeline",
	};

	for (auto &tag : playback_order)
	{
		if (module_only && tag != RESOURCE_SHADER_MODULE)
			continue;

		LOGI("Replaying tag: %s\n", tag_names[tag]);
		const unordered_set<Hash> *filter = nullptr;

		if (use_filter)
		{
			switch (tag)
			{
			case RESOURCE_SHADER_MODULE: filter = &replayer.filter_modules; break;
			case RESOURCE_GRAPHICS_PIPELINE: filter = &replayer.filter_graphics; break;
			case RESOURCE_COMPUTE_PIPELINE: filter = &replayer.filter_compute; break;
			case RESOURCE_RAYTRACING_PIPELINE: filter = &replayer.filter_raytracing; break;
			default: break;
			}
		}

		replay_all_hashes(tag, *resolver, state_replayer, replayer, state_json, filter);
		LOGI("Replayed tag: %s\n", tag_names[tag]);
	}

	unordered_set<VkShaderModule> unique_shader_modules;

	if (module_only)
	{
		string disassembled;
		size_t module_count = replayer.shader_module_infos.size();
		for (size_t i = 0; i < module_count; i++)
		{
			auto *module_info = replayer.shader_module_infos[i];
			disassembled = disassemble_spirv(device, VK_NULL_HANDLE, method, VK_SHADER_STAGE_ALL,
			                                 module_info, nullptr);

			auto module_hash = replayer.module_hashes[i];
			string path = output + "/" + uint64_string(module_hash);

			if (disasm_match.empty())
				LOGI("Dumping disassembly to: %s\n", path.c_str());
			else if (disassembled.find(disasm_match) != std::string::npos)
				LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

			if (!write_string_to_file(path.c_str(), disassembled.c_str()))
			{
				LOGE("Failed to write disassembly to file: %s\n", output.c_str());
				return EXIT_FAILURE;
			}
		}
	}
	else
	{
		string disassembled;
		size_t graphics_pipeline_count = replayer.graphics_infos.size();
		for (size_t i = 0; i < graphics_pipeline_count; i++)
		{
			auto *info = replayer.graphics_infos[i];
			for (uint32_t j = 0; j < info->stageCount; j++)
			{
				VkShaderModule module = info->pStages[j].module;
				unique_shader_modules.insert(module);
				unsigned index = replayer.module_to_index[module];
				auto *module_info = replayer.shader_module_infos[index];
				disassembled = disassemble_spirv(device, replayer.graphics_pipelines[i], method, info->pStages[j].stage,
				                                 module_info, info->pStages[j].pName);

				Hash module_hash = replayer.module_hashes[index];

				string path = output + "/" + uint64_string(module_hash) + "." +
				              info->pStages[j].pName + "." +
				              uint64_string(replayer.graphics_hashes[i]) +
				              "." + stage_to_string(info->pStages[j].stage);

				if (disasm_match.empty())
					LOGI("Dumping disassembly to: %s\n", path.c_str());
				else if (disassembled.find(disasm_match) != std::string::npos)
					LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

				if (!write_string_to_file(path.c_str(), disassembled.c_str()))
				{
					LOGE("Failed to write disassembly to file: %s\n", output.c_str());
					return EXIT_FAILURE;
				}
			}
		}

		size_t compute_pipeline_count = replayer.compute_infos.size();
		for (size_t i = 0; i < compute_pipeline_count; i++)
		{
			auto *info = replayer.compute_infos[i];
			VkShaderModule module = info->stage.module;
			unique_shader_modules.insert(module);

			unsigned index = replayer.module_to_index[module];
			auto *module_info = replayer.shader_module_infos[index];
			disassembled = disassemble_spirv(device, replayer.compute_pipelines[i], method, info->stage.stage,
			                                 module_info, info->stage.pName);

			Hash module_hash = replayer.module_hashes[index];

			string path = output + "/" + uint64_string(module_hash) + "." +
			              info->stage.pName + "." +
			              uint64_string(replayer.compute_hashes[i]) +
			              "." + stage_to_string(info->stage.stage);

			if (disasm_match.empty())
				LOGI("Dumping disassembly to: %s\n", path.c_str());
			else if (disassembled.find(disasm_match) != std::string::npos)
				LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

			if (!write_string_to_file(path.c_str(), disassembled.c_str()))
			{
				LOGE("Failed to write disassembly to file: %s\n", output.c_str());
				return EXIT_FAILURE;
			}
		}

		size_t raytracing_pipeline_count = replayer.raytracing_infos.size();
		for (size_t i = 0; i < raytracing_pipeline_count; i++)
		{
			auto *info = replayer.raytracing_infos[i];
			for (uint32_t j = 0; j < info->stageCount; j++)
			{
				VkShaderModule module = info->pStages[j].module;
				unique_shader_modules.insert(module);
				unsigned index = replayer.module_to_index[module];
				auto *module_info = replayer.shader_module_infos[index];
				disassembled = disassemble_spirv(device, replayer.raytracing_pipelines[i], method, info->pStages[j].stage,
												 module_info, info->pStages[j].pName);

				Hash module_hash = replayer.module_hashes[index];

				string path = output + "/" + uint64_string(module_hash) + "." +
						info->pStages[j].pName + "." +
						uint64_string(replayer.raytracing_hashes[i]) +
						"." + stage_to_string(info->pStages[j].stage);

				if (disasm_match.empty())
					LOGI("Dumping disassembly to: %s\n", path.c_str());
				else if (disassembled.find(disasm_match) != std::string::npos)
					LOGI("Found matching string, dumping disassembly to: %s\n", path.c_str());

				if (!write_string_to_file(path.c_str(), disassembled.c_str()))
				{
					LOGE("Failed to write disassembly to file: %s\n", output.c_str());
					return EXIT_FAILURE;
				}
			}
		}

		LOGI("Shader modules used: %u, shader modules in database: %u\n",
		     unsigned(unique_shader_modules.size()), unsigned(replayer.shader_module_infos.size()));
	}
	return EXIT_SUCCESS;
}